

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O3

int __thiscall ncnn::Gemm_x86_fma::create_pipeline(Gemm_x86_fma *this,Option *opt)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int max_kk;
  int iVar5;
  Mat *pMVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  int max_ii;
  int iVar10;
  Mat *pMVar11;
  ulong uVar12;
  int iVar13;
  int j;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  undefined4 uStack_84;
  undefined4 uStack_80;
  int iStack_7c;
  size_t local_78;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  int iStack_5c;
  size_t sStack_58;
  int local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar5 = create_pipeline_int8(this,opt);
    return iVar5;
  }
  if ((this->super_Gemm).constantA == 0) {
LAB_004b2666:
    if ((this->super_Gemm).constantB != 0) {
      iVar5 = (this->super_Gemm).constantN;
      iVar1 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk
                (0,iVar5,iVar1,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N
                 ,(this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      iVar14 = (iVar5 + TILE_N + -1) / TILE_N;
      iVar10 = (iVar1 + TILE_K + -1) / TILE_K;
      Mat::create(&this->BT_data,TILE_K * TILE_N,iVar10,iVar14,4,(Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_004b282c;
      iVar14 = iVar14 * iVar10;
      if (0 < iVar14) {
        pMVar6 = &(this->super_Gemm).B_data;
        iVar9 = 0;
        do {
          j = TILE_N * (iVar9 / iVar10);
          iVar13 = TILE_K * (int)((long)iVar9 % (long)iVar10);
          iVar16 = iVar5 - j;
          if (TILE_N < iVar5 - j) {
            iVar16 = TILE_N;
          }
          max_kk = iVar1 - iVar13;
          if (TILE_K < iVar1 - iVar13) {
            max_kk = TILE_K;
          }
          sVar2 = (this->BT_data).elemsize;
          pMVar11 = (Mat *)((long)(this->BT_data).data +
                           ((long)iVar9 % (long)iVar10 & 0xffffffffU) * (long)(this->BT_data).w *
                           sVar2 + (long)(iVar9 / iVar10) * (this->BT_data).cstep * sVar2);
          if ((this->super_Gemm).transB == 0) {
            transpose_pack_B_tile(pMVar6,pMVar11,j,iVar16,iVar13,max_kk);
          }
          else {
            pack_B_tile(pMVar6,pMVar11,j,iVar16,iVar13,max_kk);
          }
          iVar9 = iVar9 + 1;
        } while (iVar14 != iVar9);
      }
      if (opt->lightmode != false) {
        piVar7 = (this->super_Gemm).B_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pvVar3 = (this->super_Gemm).B_data.data;
            pAVar4 = (this->super_Gemm).B_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).B_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).B_data.elemsize + 4) = 0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar7 = (this->super_Gemm).C_data.refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      piVar7 = (this->CT_data).refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pvVar3 = (this->CT_data).data;
          pAVar4 = (this->CT_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      pMVar6 = &(this->super_Gemm).C_data;
      pMVar11 = &this->CT_data;
      piVar7 = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (this->super_Gemm).C_data.data;
      (this->CT_data).refcount = piVar7;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar5 = (this->super_Gemm).C_data.w;
      iVar1 = (this->super_Gemm).C_data.h;
      iVar10 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar5;
      (this->CT_data).h = iVar1;
      (this->CT_data).d = iVar10;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (((this->super_Gemm).constant_broadcast_type_C == 3) && (opt->use_packing_layout == true))
      {
        uVar8 = (this->super_Gemm).constantM;
        iVar5 = 8;
        if ((uVar8 & 7) != 0) {
          iVar5 = (uint)((uVar8 & 3) == 0) * 3 + 1;
        }
        convert_packing(pMVar6,pMVar11,iVar5,opt);
      }
      if ((this->super_Gemm).beta != 1.0) {
        local_48 = 0;
        TILE_M = 0;
        uStack_84 = 0;
        uStack_80 = 0;
        local_78 = SUB128(ZEXT812(0),4);
        local_70 = 0;
        local_68 = (Allocator *)0x0;
        iStack_60 = 0;
        local_50 = 0;
        iStack_7c = TILE_M;
        iStack_5c = TILE_M;
        sStack_58 = local_78;
        Mat::create_like((Mat *)&TILE_M,pMVar11,(Allocator *)0x0);
        uVar8 = (this->CT_data).c * (int)(this->CT_data).cstep * (this->CT_data).elempack;
        if (0 < (int)uVar8) {
          pvVar3 = pMVar11->data;
          uVar12 = 0;
          do {
            *(float *)(CONCAT44(uStack_84,TILE_M) + uVar12 * 4) =
                 (this->super_Gemm).beta * *(float *)((long)pvVar3 + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar8 != uVar12);
        }
        piVar7 = (int *)CONCAT44(iStack_7c,uStack_80);
        if (pMVar11 != (Mat *)&TILE_M) {
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = (this->CT_data).refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar3 = (this->CT_data).data;
              pAVar4 = (this->CT_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          piVar7 = (int *)CONCAT44(iStack_7c,uStack_80);
          (this->CT_data).data = (void *)CONCAT44(uStack_84,TILE_M);
          (this->CT_data).refcount = (int *)CONCAT44(iStack_7c,uStack_80);
          (this->CT_data).elemsize = local_78;
          (this->CT_data).elempack = local_70;
          (this->CT_data).allocator = local_68;
          (this->CT_data).dims = iStack_60;
          (this->CT_data).w = iStack_5c;
          (this->CT_data).h = (undefined4)sStack_58;
          (this->CT_data).d = sStack_58._4_4_;
          (this->CT_data).c = local_50;
          (this->CT_data).cstep = local_48;
        }
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_68 == (Allocator *)0x0) {
              if ((void *)CONCAT44(uStack_84,TILE_M) != (void *)0x0) {
                free((void *)CONCAT44(uStack_84,TILE_M));
              }
            }
            else {
              (*local_68->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        piVar7 = (this->super_Gemm).C_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pvVar3 = (this->super_Gemm).C_data.data;
            pAVar4 = (this->super_Gemm).C_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).C_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).C_data.elemsize + 4) = 0;
        pMVar6->data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar5 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = opt->num_threads;
      iVar5 = 0;
    }
  }
  else {
    uVar8 = (this->super_Gemm).constantM;
    iVar5 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk
              (uVar8,0,iVar5,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar1 = TILE_K;
    local_40 = (ulong)(uint)TILE_M;
    uVar12 = (long)(int)(uVar8 + TILE_M + -1) / (long)TILE_M;
    iVar10 = (int)uVar12;
    local_38 = (ulong)uVar8;
    Mat::create(&this->AT_data,TILE_K * TILE_M,(TILE_K + iVar5 + -1) / TILE_K,iVar10,4,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      if (0 < iVar10) {
        pMVar6 = &(this->super_Gemm).A_data;
        uVar15 = 0;
        do {
          if (0 < iVar5) {
            iVar14 = (int)local_40;
            iVar9 = (int)uVar15 * iVar14;
            iVar10 = (int)local_38 - iVar9;
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            iVar16 = 0;
            iVar14 = iVar5;
            do {
              iVar13 = iVar14;
              if (iVar1 < iVar14) {
                iVar13 = iVar1;
              }
              sVar2 = (this->AT_data).elemsize;
              pMVar11 = (Mat *)((long)(this->AT_data).data +
                               (long)(this->AT_data).w * sVar2 * (long)(iVar16 / iVar1) +
                               (this->AT_data).cstep * uVar15 * sVar2);
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile(pMVar6,pMVar11,iVar9,iVar10,iVar16,iVar13);
              }
              else {
                transpose_pack_A_tile(pMVar6,pMVar11,iVar9,iVar10,iVar16,iVar13);
              }
              iVar16 = iVar16 + iVar1;
              iVar14 = iVar14 - iVar1;
            } while (iVar16 < iVar5);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uVar12 & 0xffffffff));
      }
      if (opt->lightmode != false) {
        piVar7 = (this->super_Gemm).A_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pvVar3 = (this->super_Gemm).A_data.data;
            pAVar4 = (this->super_Gemm).A_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).A_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).A_data.elemsize + 4) = 0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_004b2666;
    }
LAB_004b282c:
    iVar5 = -100;
  }
  return iVar5;
}

Assistant:

int Gemm_x86_fma::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}